

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utf.cpp
# Opt level: O0

cpstring * __thiscall
(anonymous_namespace)::Utf8Decode::decode_abi_cxx11_
          (cpstring *__return_storage_ptr__,void *this,utf8_decoder *decoder,char *src)

{
  bool bVar1;
  char32_t *pcVar2;
  maybe<char32_t,_void> local_34;
  maybe<char32_t,_void> code_point;
  char *src_local;
  utf8_decoder *decoder_local;
  Utf8Decode *this_local;
  cpstring *result;
  
  code_point._3_1_ = 0;
  unique0x100000ad = (uint8_t *)src;
  std::__cxx11::u32string::u32string((u32string *)__return_storage_ptr__);
  for (; *stack0xffffffffffffffd8 != '\0'; register0x00000000 = stack0xffffffffffffffd8 + 1) {
    pstore::utf::utf8_decoder::get(&local_34,decoder,*stack0xffffffffffffffd8);
    bVar1 = pstore::maybe::operator_cast_to_bool((maybe *)&local_34);
    if (bVar1) {
      pcVar2 = pstore::maybe<char32_t,_void>::operator*(&local_34);
      std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
      operator+=(__return_storage_ptr__,*pcVar2);
    }
    pstore::maybe<char32_t,_void>::~maybe(&local_34);
  }
  return __return_storage_ptr__;
}

Assistant:

cpstring decode (pstore::utf::utf8_decoder & decoder, char const * src) {
            cpstring result;
            for (; *src != '\0'; ++src) {
                if (pstore::maybe<char32_t> const code_point =
                        decoder.get (static_cast<std::uint8_t> (*src))) {
                    result += *code_point;
                }
            }
            return result;
        }